

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# filesystem.c++
# Opt level: O3

String * kj::Path::stripNul(String *__return_storage_ptr__,String *input)

{
  char cVar1;
  char *pcVar2;
  size_t sVar3;
  char *pcVar4;
  size_t capacity;
  char *pcVar5;
  Vector<char> local_58;
  
  sVar3 = (input->content).size_;
  capacity = sVar3 - 1;
  if (sVar3 == 0) {
    capacity = 0;
  }
  pcVar2 = (char *)_::HeapArrayDisposer::allocateImpl
                             (1,0,capacity,(_func_void_void_ptr *)0x0,(_func_void_void_ptr *)0x0);
  local_58.builder.endPtr = pcVar2 + capacity;
  local_58.builder.disposer = (ArrayDisposer *)&_::HeapArrayDisposer::instance;
  pcVar4 = (input->content).ptr;
  sVar3 = (input->content).size_;
  pcVar5 = pcVar4 + (sVar3 - 1);
  local_58.builder.ptr = pcVar2;
  local_58.builder.pos = pcVar2;
  if (sVar3 == 0) {
    pcVar5 = (char *)0x0;
    pcVar4 = (char *)0x0;
  }
  for (; pcVar4 != pcVar5; pcVar4 = pcVar4 + 1) {
    cVar1 = *pcVar4;
    if (cVar1 != '\0') {
      if (pcVar2 == local_58.builder.endPtr) {
        sVar3 = ((long)pcVar2 - (long)local_58.builder.ptr) * 2;
        if (pcVar2 == local_58.builder.ptr) {
          sVar3 = 4;
        }
        Vector<char>::setCapacity(&local_58,sVar3);
        pcVar2 = local_58.builder.pos;
      }
      *pcVar2 = cVar1;
      pcVar2 = local_58.builder.pos + 1;
      local_58.builder.pos = pcVar2;
    }
  }
  if (pcVar2 == local_58.builder.endPtr) {
    sVar3 = 4;
    if (local_58.builder.endPtr != local_58.builder.ptr) {
      sVar3 = ((long)local_58.builder.endPtr - (long)local_58.builder.ptr) * 2;
    }
    Vector<char>::setCapacity(&local_58,sVar3);
    pcVar2 = local_58.builder.pos;
  }
  *pcVar2 = '\0';
  local_58.builder.pos = local_58.builder.pos + 1;
  if (local_58.builder.pos != local_58.builder.endPtr) {
    Vector<char>::setCapacity(&local_58,(long)local_58.builder.pos - (long)local_58.builder.ptr);
  }
  (__return_storage_ptr__->content).ptr = local_58.builder.ptr;
  (__return_storage_ptr__->content).size_ = (long)local_58.builder.pos - (long)local_58.builder.ptr;
  (__return_storage_ptr__->content).disposer = local_58.builder.disposer;
  return __return_storage_ptr__;
}

Assistant:

String Path::stripNul(String input) {
  kj::Vector<char> output(input.size());
  for (char c: input) {
    if (c != '\0') output.add(c);
  }
  output.add('\0');
  return String(output.releaseAsArray());
}